

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v2mplayer.cpp
# Opt level: O0

void anon_unknown.dwarf_1f3e::UpdateSampleDelta
               (uint32_t nexttime,uint32_t time,uint32_t usecs,uint32_t td2,uint32_t *smplrem,
               uint32_t *smpldelta)

{
  uint uVar1;
  ulong uVar2;
  uint32_t r;
  uint64_t t;
  uint32_t *smpldelta_local;
  uint32_t *smplrem_local;
  uint32_t td2_local;
  uint32_t usecs_local;
  uint32_t time_local;
  uint32_t nexttime_local;
  
  uVar2 = ((ulong)(nexttime - time) * (ulong)usecs) / (ulong)td2;
  uVar1 = *smplrem;
  *smplrem = *smplrem + (int)(uVar2 >> 0x20);
  *smpldelta = *smpldelta + (int)uVar2;
  if (*smplrem < uVar1) {
    *smpldelta = *smpldelta + 1;
  }
  return;
}

Assistant:

void UpdateSampleDelta(uint32_t nexttime, uint32_t time, uint32_t usecs, uint32_t td2, uint32_t *smplrem, uint32_t *smpldelta)
    {
        // performs 64bit (nexttime-time)*usecs/td2 and a 32.32bit addition to smpldelta:smplrem
        uint64_t t = ((nexttime - time) * (uint64_t) usecs) / td2;
        uint32_t r = *smplrem;
        *smplrem   += (t >> 32);        // bits 32-63
        *smpldelta += (t & 0xffffffff); // bits 00-31
        if (*smplrem < r)
        {
            *smpldelta += 1;
        }
    }